

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  pointer ppFVar1;
  DescriptorPool *this_00;
  FileDescriptorProto *from;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  void **ppvVar8;
  iterator iVar9;
  undefined8 *puVar10;
  FileDescriptor *pFVar11;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *this_01;
  Version *pVVar12;
  size_t sVar13;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  program;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *pVVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 *puVar15;
  Arena *arena;
  string *psVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *part;
  ulong uVar17;
  CommandLineInterface *this_03;
  Arg *a0;
  Arg *a1;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_04;
  int iVar18;
  pointer ppFVar19;
  string_view name;
  string_view format;
  string_view format_00;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range2;
  Subprocess subprocess;
  string communicate_error;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  char *local_1c8 [6];
  string processed_parameter;
  CodeGeneratorResponse response;
  undefined1 local_130 [48];
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_to_generate;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  CodeGeneratorRequest request;
  string local_50;
  ZeroCopyOutputStream *stream;
  
  CodeGeneratorRequest::CodeGeneratorRequest(&request);
  CodeGeneratorResponse::CodeGeneratorResponse(&response);
  std::__cxx11::string::string((string *)&processed_parameter,(string *)parameter);
  local_130._0_8_ = processed_parameter._M_string_length;
  local_130._8_8_ = processed_parameter._M_dataplus._M_p;
  local_130[0x10] = ',';
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            (&parts,(Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)local_130);
  pbVar2 = parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    __lhs = pbVar3;
    if (__lhs == pbVar2) break;
    bVar4 = std::operator==(__lhs,"bootstrap");
    pbVar3 = __lhs + 1;
  } while (!bVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  if (processed_parameter._M_string_length != 0) {
    request.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
         request.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
    if ((request.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      request.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (request.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              (&request.field_0._impl_.parameter_,&processed_parameter,
               (Arena *)request.super_Message.super_MessageLite._internal_metadata_.ptr_);
  }
  already_seen.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  already_seen.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  ppFVar1 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar19 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppFVar19 != ppFVar1;
      ppFVar19 = ppFVar19 + 1) {
    pFVar11 = *ppFVar19;
    psVar16 = pFVar11->name_;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar16->_M_dataplus)._M_p;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar16->_M_string_length;
    protobuf::internal::AddToRepeatedPtrField<std::basic_string_view<char,std::char_traits<char>>>
              (&request.field_0._impl_.file_to_generate_,
               (basic_string_view<char,_std::char_traits<char>_> *)&parts);
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT53(parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._3_5_,0x10101);
    GetTransitiveDependencies
              (this,pFVar11,&already_seen,&request.field_0._impl_.proto_file_,
               (TransitiveDependencyOptions *)&parts);
  }
  ppFVar19 = (parsed_files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar19 ==
      (parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&parts,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0xafb,"!parsed_files.empty()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&parts);
  }
  this_00 = (*ppFVar19)->pool_;
  a0 = (Arg *)&parts;
  a1 = (Arg *)local_130;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  ::
  raw_hash_set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              *)&files_to_generate,
             (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0,(hasher *)a0,(key_equal *)a1,
             (allocator_type *)&communicate_error);
  if ((GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
       ::builtin_plugins_abi_cxx11_ == '\0') &&
     (iVar18 = __cxa_guard_acquire(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                                    ::builtin_plugins_abi_cxx11_), iVar18 != 0)) {
    this_02 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)operator_new(0x20);
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_55d67;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_55d3f;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_55d4c;
    a0 = (Arg *)local_130;
    a1 = (Arg *)&communicate_error;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
    ::raw_hash_set<char_const*const*>
              (this_02,(char **)&parts,local_1c8,0,(hasher *)a0,(key_equal *)a1,
               (allocator_type *)&local_50);
    GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
    ::builtin_plugins_abi_cxx11_ =
         (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_02;
    __cxa_guard_release(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                         ::builtin_plugins_abi_cxx11_);
  }
  this_04 = &request.field_0._impl_.proto_file_;
  ppvVar8 = protobuf::internal::RepeatedPtrFieldBase::elements(&this_04->super_RepeatedPtrFieldBase)
  ;
  iVar9 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(this_04);
  for (; ppvVar8 != iVar9.it_; ppvVar8 = ppvVar8 + 1) {
    from = (FileDescriptorProto *)*ppvVar8;
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
            ::contains<std::__cxx11::string>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                        *)&files_to_generate,
                       (key_arg<std::__cxx11::basic_string<char>_> *)
                       ((ulong)(from->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
    if (bVar4) {
      puVar10 = (undefined8 *)
                ((ulong)(from->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      name._M_str = (char *)*puVar10;
      name._M_len = puVar10[1];
      pFVar11 = DescriptorPool::FindFileByName(this_00,name);
      this_01 = protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                          (&request.field_0._impl_.source_file_descriptors_.
                            super_RepeatedPtrFieldBase);
      FileDescriptorProto::operator=(this_01,from);
      FileDescriptor::CopyTo(pFVar11,from);
      if (__lhs == pbVar2) {
        FileDescriptor::CopySourceCodeInfoTo(pFVar11,from);
        bVar4 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                ::contains<std::__cxx11::string>
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                            *)GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                              ::builtin_plugins_abi_cxx11_,plugin_name);
        if (!bVar4) {
          FileDescriptor::CopyJsonNameTo(pFVar11,from);
        }
      }
      StripSourceRetentionOptions(pFVar11->pool_,from);
    }
  }
  pVVar12 = CodeGeneratorRequest::mutable_compiler_version(&request);
  *(undefined8 *)((long)&pVVar12->field_0 + 0x10) = 0x1f00000006;
  (pVVar12->field_0)._impl_.patch_ = 0;
  *(byte *)&pVVar12->field_0 = *(byte *)&pVVar12->field_0 | 0xf;
  arena = (Arena *)(pVVar12->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar12->field_0)._impl_.suffix_,"-dev",arena);
  Subprocess::Subprocess(&subprocess);
  sVar13 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::count<std::__cxx11::string>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->plugins_,plugin_name);
  program = plugin_name;
  if (sVar13 != 0) {
    program = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::
              operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&this->plugins_,plugin_name);
  }
  Subprocess::Start(&subprocess,program,(uint)(sVar13 != 0));
  communicate_error._M_dataplus._M_p = (pointer)&communicate_error.field_2;
  communicate_error._M_string_length = 0;
  communicate_error.field_2._M_local_buf[0] = '\0';
  this_03 = (CommandLineInterface *)&subprocess;
  bVar4 = Subprocess::Communicate
                    ((Subprocess *)this_03,&request.super_Message,&response.super_Message,
                     &communicate_error);
  if (bVar4) {
    stream = (ZeroCopyOutputStream *)0x0;
    for (iVar18 = 0; iVar18 < response.field_0._impl_.file_.super_RepeatedPtrFieldBase.current_size_
        ; iVar18 = iVar18 + 1) {
      pVVar14 = protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                          (&response.field_0._impl_.file_.super_RepeatedPtrFieldBase,iVar18);
      if (*(long *)(((ulong)(pVVar14->field_0)._impl_.insertion_point_.tagged_ptr_.ptr_ &
                    0xfffffffffffffffc) + 8) == 0) {
        uVar17 = (ulong)(pVVar14->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc;
        if (*(long *)(uVar17 + 8) == 0) {
          if (stream == (ZeroCopyOutputStream *)0x0) {
            parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(plugin_name->_M_dataplus)._M_p;
            parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)plugin_name->_M_string_length;
            format_00._M_str = (char *)&parts;
            format_00._M_len =
                 (size_t)"$0: First file chunk returned by plugin did not specify a file name.";
            absl::lts_20250127::Substitute_abi_cxx11_
                      ((string *)local_130,(lts_20250127 *)0x44,format_00,a0);
            psVar16 = (string *)local_130;
            goto LAB_0013efeb;
          }
        }
        else {
          if (stream != (ZeroCopyOutputStream *)0x0) {
            (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
            uVar17 = (ulong)(pVVar14->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc;
          }
          iVar7 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,uVar17);
          stream = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar7);
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&parts,
                   (string *)
                   ((ulong)(pVVar14->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
        if (stream != (ZeroCopyOutputStream *)0x0) {
          (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
        }
        puVar15 = (undefined1 *)(pVVar14->field_0)._impl_.generated_code_info_;
        if ((GeneratedCodeInfo *)puVar15 == (GeneratedCodeInfo *)0x0) {
          puVar15 = _GeneratedCodeInfo_default_instance_;
        }
        iVar7 = (*generator_context->_vptr_GeneratorContext[5])
                          (generator_context,(CommandLineInterface *)&parts,
                           (ulong)(pVVar14->field_0)._impl_.insertion_point_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc,puVar15);
        stream = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar7);
        std::__cxx11::string::~string((string *)&parts);
      }
      io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ZeroCopyOutputStream,void>
                ((CodedOutputStream *)&parts,stream);
      puVar10 = (undefined8 *)
                ((ulong)(pVVar14->field_0)._impl_.content_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      io::CodedOutputStream::WriteRaw
                ((CodedOutputStream *)&parts,(void *)*puVar10,*(int *)(puVar10 + 1));
      this_03 = (CommandLineInterface *)&parts;
      io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&parts);
    }
    bVar5 = EnforceProto3OptionalSupport
                      (this_03,plugin_name,response.field_0._impl_.supported_features_,parsed_files)
    ;
    bVar6 = EnforceEditionsSupport
                      (this,plugin_name,response.field_0._impl_.supported_features_,
                       response.field_0._impl_.minimum_edition_,
                       response.field_0._impl_.maximum_edition_,parsed_files);
    bVar4 = *(long *)(((ulong)response.field_0._impl_.error_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                     + 8) == 0;
    if (!bVar4) {
      std::__cxx11::string::_M_assign((string *)error);
    }
    bVar4 = bVar4 && (bVar5 && bVar6);
    if (stream != (ZeroCopyOutputStream *)0x0) {
      (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
    }
  }
  else {
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(plugin_name->_M_dataplus)._M_p;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plugin_name->_M_string_length;
    local_130._0_8_ = communicate_error._M_string_length;
    local_130._8_8_ = communicate_error._M_dataplus._M_p;
    format._M_str = (char *)&parts;
    format._M_len = (size_t)"$0: $1";
    absl::lts_20250127::Substitute_abi_cxx11_
              (&local_50,(lts_20250127 *)0x6,format,(Arg *)local_130,a1);
    psVar16 = &local_50;
LAB_0013efeb:
    std::__cxx11::string::operator=((string *)error,(string *)psVar16);
    std::__cxx11::string::~string((string *)psVar16);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&communicate_error);
  Subprocess::~Subprocess(&subprocess);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&files_to_generate.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~raw_hash_set(&already_seen.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
  std::__cxx11::string::~string((string *)&processed_parameter);
  CodeGeneratorResponse::~CodeGeneratorResponse(&response);
  CodeGeneratorRequest::~CodeGeneratorRequest(&request);
  return bVar4;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const std::string& plugin_name, const std::string& parameter,
    GeneratorContext* generator_context, std::string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  std::string processed_parameter = parameter;

  bool bootstrap = GetBootstrapParam(processed_parameter);

  // Build the request.
  if (!processed_parameter.empty()) {
    request.set_parameter(processed_parameter);
  }


  absl::flat_hash_set<const FileDescriptor*> already_seen;
  for (const FileDescriptor* file : parsed_files) {
    request.add_file_to_generate(file->name());
    GetTransitiveDependencies(file, &already_seen, request.mutable_proto_file(),
                              {/*.include_json_name =*/true,
                               /*.include_source_code_info =*/true,
                               /*.retain_options =*/true});
  }

  // Populate source_file_descriptors and remove source-retention options from
  // proto_file.
  ABSL_CHECK(!parsed_files.empty());
  const DescriptorPool* pool = parsed_files[0]->pool();
  absl::flat_hash_set<std::string> files_to_generate(input_files_.begin(),
                                                     input_files_.end());
  static const auto builtin_plugins = new absl::flat_hash_set<std::string>(
      {"protoc-gen-cpp", "protoc-gen-java", "protoc-gen-mutable_java",
       "protoc-gen-python"});
  for (FileDescriptorProto& file_proto : *request.mutable_proto_file()) {
    if (files_to_generate.contains(file_proto.name())) {
      const FileDescriptor* file = pool->FindFileByName(file_proto.name());
      *request.add_source_file_descriptors() = std::move(file_proto);
      file->CopyTo(&file_proto);
      // Don't populate source code info or json_name for bootstrap protos.
      if (!bootstrap) {
        file->CopySourceCodeInfoTo(&file_proto);

        // The built-in code generators didn't use the json names.
        if (!builtin_plugins->contains(plugin_name)) {
          file->CopyJsonNameTo(&file_proto);
        }
      }
      StripSourceRetentionOptions(*file->pool(), file_proto);
    }
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(PROTOBUF_VERSION / 1000000);
  version->set_minor(PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(PROTOBUF_VERSION % 1000);
  version->set_suffix(PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  std::string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = absl::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  std::unique_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); ++i) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      std::string filename = output_file.name();
      // Open a file for insert.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(
          generator_context->OpenForInsertWithGeneratedCodeInfo(
              filename, output_file.insertion_point(),
              output_file.generated_code_info()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == nullptr) {
      *error = absl::Substitute(
          "$0: First file chunk returned by plugin did not specify a file "
          "name.",
          plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  bool success = true;
  if (!EnforceProto3OptionalSupport(plugin_name, response.supported_features(),
                                    parsed_files)) {
    success = false;
  }
  if (!EnforceEditionsSupport(plugin_name, response.supported_features(),
                              static_cast<Edition>(response.minimum_edition()),
                              static_cast<Edition>(response.maximum_edition()),
                              parsed_files)) {
    success = false;
  }
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    success = false;
  }

  return success;
}